

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O3

void print_conflicts(int state)

{
  action *paVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  paVar1 = parser[state];
  if (paVar1 != (action *)0x0) {
    uVar3 = 0xffffffff;
    iVar4 = -1;
    iVar2 = -1;
    do {
      if (paVar1->suppressed != '\x02') {
        if (paVar1->symbol == iVar2) {
          if (paVar1->suppressed == '\x01') {
            if ((final_state == state) && (iVar2 == 0)) {
              fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (accept, reduce %d) on $end\n"
                      ,(ulong)(uint)state,(ulong)(paVar1->number - 2));
              iVar2 = 0;
            }
            else if (iVar4 == 1) {
              fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (shift %d, reduce %d) on %s\n"
                      ,(ulong)(uint)state,(ulong)uVar3,(ulong)(paVar1->number - 2),
                      symbol_name[iVar2]);
              iVar4 = 1;
            }
            else {
              fprintf((FILE *)verbose_file,
                      "%d: reduce/reduce conflict (reduce %d, reduce %d) on %s\n",(ulong)(uint)state
                      ,(ulong)(uVar3 - 2),(ulong)(paVar1->number - 2),symbol_name[iVar2]);
            }
          }
        }
        else {
          uVar3 = paVar1->number;
          iVar4 = (paVar1->action_code != '\x01') + 1;
          iVar2 = paVar1->symbol;
        }
      }
      paVar1 = paVar1->next;
    } while (paVar1 != (action *)0x0);
  }
  return;
}

Assistant:

void print_conflicts(int state)
{
    register int symbol, act, number;
    register action *p;

    symbol = act = number = -1;
    for (p = parser[state]; p; p = p->next)
    {
	if (p->suppressed == 2)
	    continue;

	if (p->symbol != symbol)
	{
	    symbol = p->symbol;
	    number = p->number;
	    if (p->action_code == SHIFT)
		act = SHIFT;
	    else
		act = REDUCE;
	}
	else if (p->suppressed == 1)
	{
	    if (state == final_state && symbol == 0)
	    {
		fprintf(verbose_file, "%d: shift/reduce conflict "
			"(accept, reduce %d) on $end\n", state, p->number - 2);
	    }
	    else
	    {
		if (act == SHIFT)
		{
		    fprintf(verbose_file, "%d: shift/reduce conflict "
			    "(shift %d, reduce %d) on %s\n", state, number,
			    p->number - 2, symbol_name[symbol]);
		}
		else
		{
		    fprintf(verbose_file, "%d: reduce/reduce conflict "
			    "(reduce %d, reduce %d) on %s\n", state,
			    number - 2, p->number - 2, symbol_name[symbol]);
		}
	    }
	}
    }
}